

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd.h
# Opt level: O3

float_type get_time_step_fdtd(fdtd *fdtd)

{
  undefined8 in_RCX;
  code *extraout_RDX;
  code *in_RSI;
  void *pvVar1;
  double in_XMM0_Qa;
  double dVar2;
  
  if (2 < (ulong)fdtd->type) {
    get_time_step_fdtd_cold_1();
    if ((fdtd->field_1).twoDims.permeability_inv != (void *)0x0) {
      in_XMM0_Qa = 0.0;
      pvVar1 = (void *)0x0;
      do {
        dVar2 = (double)(*in_RSI)(in_XMM0_Qa,in_RCX);
        (fdtd->field_1).oneDim.permittivity_inv[(long)pvVar1] =
             1.0 / (dVar2 * 1.2566370614359173e-06);
        dVar2 = (double)(*extraout_RDX)(in_XMM0_Qa,in_RCX);
        (fdtd->field_1).oneDim.hy[(long)pvVar1] = 1.0 / (dVar2 * 8.85418781762039e-12);
        pvVar1 = (void *)((long)pvVar1 + 1);
        in_XMM0_Qa = in_XMM0_Qa + *(double *)fdtd;
      } while (pvVar1 < (fdtd->field_1).twoDims.permeability_inv);
    }
    return in_XMM0_Qa;
  }
  return *(float_type *)((long)&fdtd->field_1 + (ulong)fdtd->type * 8 + 8);
}

Assistant:

inline float_type get_time_step_fdtd(const struct fdtd *fdtd) {
  switch (fdtd->type) {
  case fdtd_one_dim:
    return fdtd->oneDim.dt;
  case fdtd_two_dims:
    return fdtd->twoDims.dt;
  case fdtd_three_dims:
    return fdtd->threeDims.dt;
  default:
    fprintf(stderr, "get_time_step: unknown fdtd type\n");
    exit(EXIT_FAILURE);
  }
}